

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O2

u32 u32Shuffle(u32 w)

{
  uint uVar1;
  
  uVar1 = ((w >> 8 ^ w) & 0xff00) * 0x101 ^ w;
  uVar1 = ((uVar1 >> 4 ^ uVar1) & 0xf000f0) * 0x11 ^ uVar1;
  uVar1 = ((uVar1 >> 2 ^ uVar1) & 0xc0c0c0c) * 5 ^ uVar1;
  return ((uVar1 >> 1 ^ uVar1) & 0x22222222) * 3 ^ uVar1;
}

Assistant:

u32 u32Shuffle(register u32 w)
{
	register u32 t;
	t = (w ^ (w >> 8)) & 0x0000FF00, w ^= t ^ (t << 8);
	t = (w ^ (w >> 4)) & 0x00F000F0, w ^= t ^ (t << 4);
	t = (w ^ (w >> 2)) & 0x0C0C0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 1)) & 0x22222222, w ^= t ^ (t << 1);
	t = 0;
	return w;
}